

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::PropertyIdOnRegSlotsContainer::Insert
          (PropertyIdOnRegSlotsContainer *this,RegSlot reg,PropertyId propId)

{
  code *pcVar1;
  bool bVar2;
  int **ppiVar3;
  undefined4 *puVar4;
  PropertyId propId_local;
  RegSlot reg_local;
  PropertyIdOnRegSlotsContainer *this_local;
  
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
  if (*ppiVar3 == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1610,"(propertyIdsForRegSlots)","propertyIdsForRegSlots");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->length <= reg) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1611,"(reg < length)","reg < length");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
  if ((*ppiVar3)[reg] != 0) {
    ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
    if ((*ppiVar3)[reg] != propId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1616,
                                  "(propertyIdsForRegSlots[reg] == 0 || propertyIdsForRegSlots[reg] == propId)"
                                  ,
                                  "propertyIdsForRegSlots[reg] == 0 || propertyIdsForRegSlots[reg] == propId"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)this);
  (*ppiVar3)[reg] = propId;
  return;
}

Assistant:

void PropertyIdOnRegSlotsContainer::Insert(RegSlot reg, PropertyId propId)
    {
        //
        // Reg is being used as an index;

        Assert(propertyIdsForRegSlots);
        Assert(reg < length);

        //
        // the current reg is unaccounted for const reg count. while fetching calculate the actual regslot value.

        Assert(propertyIdsForRegSlots[reg] == 0 || propertyIdsForRegSlots[reg] == propId);
        propertyIdsForRegSlots[reg] = propId;
    }